

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O0

void __thiscall
SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::
read_chunked_transfer_encoded_chunk
          (ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this,
          shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session>
          *session,shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *chunks_streambuf,
          unsigned_long length)

{
  element_type *peVar1;
  char *__p;
  element_type *peVar2;
  element_type *peVar3;
  pointer pcVar4;
  element_type *peVar5;
  size_t sVar6;
  size_t sVar7;
  element_type *peVar8;
  error_code eVar9;
  undefined1 local_288 [8];
  error_code ec;
  ostream ostream;
  error_code local_160 [2];
  unique_ptr<char[],_std::default_delete<char[]>_> local_140;
  unique_ptr<char[],_std::default_delete<char[]>_> buffer;
  ostream tmp_stream;
  unsigned_long length_local;
  shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *chunks_streambuf_local;
  shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session>
  *session_local;
  ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this_local;
  
  peVar1 = std::
           __shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>::
           get(&chunks_streambuf->
                super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              );
  std::ostream::ostream(&buffer,&peVar1->super_streambuf);
  if (length != 0) {
    __p = (char *)operator_new__(length);
    std::unique_ptr<char[],std::default_delete<char[]>>::
    unique_ptr<char*,std::default_delete<char[]>,void,bool>
              ((unique_ptr<char[],std::default_delete<char[]>> *)&local_140,__p);
    peVar2 = std::
             __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)session);
    peVar3 = std::
             __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar2->response);
    pcVar4 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_140);
    std::istream::read((char *)&peVar3->content,(long)pcVar4);
    pcVar4 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_140);
    std::ostream::write((char *)&buffer,(long)pcVar4);
    peVar5 = std::
             __shared_ptr_access<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)chunks_streambuf);
    sVar6 = asio::basic_streambuf<std::allocator<char>_>::size(peVar5);
    peVar5 = std::
             __shared_ptr_access<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)chunks_streambuf);
    sVar7 = asio::basic_streambuf<std::allocator<char>_>::max_size(peVar5);
    if (sVar6 == sVar7) {
      peVar2 = std::
               __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)session);
      peVar8 = std::
               __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)session);
      eVar9 = std::make_error_code(message_size);
      local_160[0]._M_cat = eVar9._M_cat;
      local_160[0]._M_value = eVar9._M_value;
      std::
      function<void_(const_std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection>_&,_const_std::error_code_&)>
      ::operator()(&peVar2->callback,&peVar8->connection,local_160);
    }
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_140);
    if (sVar6 == sVar7) goto LAB_001f2ed1;
  }
  peVar2 = std::
           __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)session);
  std::
  __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&peVar2->response);
  std::istream::get();
  peVar2 = std::
           __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)session);
  std::
  __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&peVar2->response);
  std::istream::get();
  if (length == 0) {
    peVar5 = std::
             __shared_ptr_access<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)chunks_streambuf);
    sVar6 = asio::basic_streambuf<std::allocator<char>_>::size(peVar5);
    if (sVar6 != 0) {
      peVar2 = std::
               __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)session);
      peVar3 = std::
               __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar2->response);
      std::ostream::ostream(&ec._M_cat,(streambuf *)peVar3);
      peVar1 = std::
               __shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ::get(&chunks_streambuf->
                      super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    );
      std::ostream::operator<<(&ec._M_cat,&peVar1->super_streambuf);
      std::ostream::~ostream(&ec._M_cat);
    }
    std::error_code::error_code((error_code *)local_288);
    peVar2 = std::
             __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)session);
    peVar8 = std::
             __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)session);
    std::
    function<void_(const_std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection>_&,_const_std::error_code_&)>
    ::operator()(&peVar2->callback,&peVar8->connection,(error_code *)local_288);
  }
  else {
    read_chunked_transfer_encoded(this,session,chunks_streambuf);
  }
LAB_001f2ed1:
  std::ostream::~ostream(&buffer);
  return;
}

Assistant:

void read_chunked_transfer_encoded_chunk(const std::shared_ptr<Session> &session, const std::shared_ptr<asio::streambuf> &chunks_streambuf, unsigned long length) {
      std::ostream tmp_stream(chunks_streambuf.get());
      if(length > 0) {
        std::unique_ptr<char[]> buffer(new char[length]);
        session->response->content.read(buffer.get(), static_cast<std::streamsize>(length));
        tmp_stream.write(buffer.get(), static_cast<std::streamsize>(length));
        if(chunks_streambuf->size() == chunks_streambuf->max_size()) {
          session->callback(session->connection, make_error_code::make_error_code(errc::message_size));
          return;
        }
      }

      // Remove "\r\n"
      session->response->content.get();
      session->response->content.get();

      if(length > 0)
        read_chunked_transfer_encoded(session, chunks_streambuf);
      else {
        if(chunks_streambuf->size() > 0) {
          std::ostream ostream(&session->response->streambuf);
          ostream << chunks_streambuf.get();
        }
        error_code ec;
        session->callback(session->connection, ec);
      }
    }